

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Instruction::dump(Instruction *this,Vector<unsigned_int> *out)

{
  uint uVar1;
  iterator iVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  uint local_24;
  
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar2,&local_24);
  }
  else {
    *iVar2._M_current =
         (((uint)(*(int *)&(this->operands).
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                 *(int *)&(this->operands).
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) +
         ((uint)(this->resultId != 0) - (uint)(this->typeId == 0))) * 0x10000 + 0x20000 |
         this->opCode;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  uVar1 = this->typeId;
  if (uVar1 != 0) {
    iVar2._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar2,
                 &this->typeId);
    }
    else {
      *iVar2._M_current = uVar1;
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  uVar1 = this->resultId;
  if (uVar1 != 0) {
    iVar2._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar2,
                 &this->resultId);
    }
    else {
      *iVar2._M_current = uVar1;
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  puVar3 = (this->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      iVar2._M_current =
           (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar2,
                   (uint *)((long)puVar3 + lVar5));
        puVar3 = (this->operands).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar2._M_current = *(uint *)((long)puVar3 + lVar5);
        (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 4;
    } while (lVar4 < (int)((ulong)((long)(this->operands).
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                          >> 2));
  }
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        // Compute the wordCount
        unsigned int wordCount = 1;
        if (typeId)
            ++wordCount;
        if (resultId)
            ++wordCount;
        wordCount += (unsigned int)operands.size();

        // Write out the beginning of the instruction
        out.push_back(((wordCount) << WordCountShift) | opCode);
        if (typeId)
            out.push_back(typeId);
        if (resultId)
            out.push_back(resultId);

        // Write out the operands
        for (int op = 0; op < (int)operands.size(); ++op)
            out.push_back(operands[op]);
    }